

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_replace_node(REF_CELL ref_cell,REF_INT old_node,REF_INT new_node)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  if (old_node != new_node) {
    pRVar1 = ref_cell->ref_adj;
    iVar3 = -1;
    if ((-1 < old_node) && (iVar3 = -1, old_node < pRVar1->nnode)) {
      iVar3 = pRVar1->first[(uint)old_node];
    }
    while (iVar3 != -1) {
      iVar3 = pRVar1->item[iVar3].ref;
      lVar7 = (long)iVar3;
      for (lVar8 = 0; (int)lVar8 < ref_cell->node_per; lVar8 = lVar8 + 1) {
        if (ref_cell->c2n[ref_cell->size_per * lVar7 + lVar8] == old_node) {
          uVar4 = ref_adj_remove(ref_cell->ref_adj,old_node,iVar3);
          if (uVar4 != 0) {
            pcVar6 = "unregister cell";
            uVar5 = 0x344;
LAB_001db15f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   uVar5,"ref_cell_replace_node",(ulong)uVar4,pcVar6);
            return uVar4;
          }
          pRVar2 = ref_cell->c2n;
          pRVar2[ref_cell->size_per * lVar7 + lVar8] = new_node;
          uVar4 = ref_adj_add(ref_cell->ref_adj,pRVar2[ref_cell->size_per * lVar7 + lVar8],iVar3);
          if (uVar4 != 0) {
            pcVar6 = "register cell with id";
            uVar5 = 0x348;
            goto LAB_001db15f;
          }
        }
      }
      iVar3 = -1;
      if ((-1 < old_node) && (iVar3 = -1, old_node < pRVar1->nnode)) {
        iVar3 = pRVar1->first[(uint)old_node];
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_node(REF_CELL ref_cell, REF_INT old_node,
                                         REF_INT new_node) {
  REF_ADJ ref_adj = ref_cell_adj(ref_cell);
  REF_INT node;
  REF_INT item, cell;

  if (old_node == new_node) return REF_SUCCESS;

  item = ref_adj_first(ref_adj, old_node);
  while (ref_adj_valid(item)) {
    cell = ref_adj_item_ref(ref_adj, item);

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (old_node == ref_cell_c2n(ref_cell, node, cell)) {
        RSS(ref_adj_remove(ref_cell->ref_adj,
                           ref_cell_c2n(ref_cell, node, cell), cell),
            "unregister cell");
        ref_cell_c2n(ref_cell, node, cell) = new_node;
        RSS(ref_adj_add(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                        cell),
            "register cell with id");
      }

    item = ref_adj_first(ref_adj, old_node);
  }

  return REF_SUCCESS;
}